

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
to_string_function::evaluate
          (to_string_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  reference pbVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  assertion_error *this_00;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&val,"assertion \'args.size() == *this->arity()\' failed at  <> :0",
               &local_31);
    assertion_error::assertion_error(this_00,&val);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ != value) {
    std::error_code::operator=(ec,invalid_type);
    pbVar2 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             ::null_value(context);
    return pbVar2;
  }
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
            (&val,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                  (ppVar1->field_1).expression_);
  pbVar3 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
           create_json<std::__cxx11::string>
                     ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                       *)context,&val);
  std::__cxx11::string::~string((string *)&val);
  return pbVar3;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                return *context.create_json(arg0.template as<string_type>());
            }